

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

ArrayWithPreallocation<soul::Structure::Member,_8UL> * __thiscall
soul::ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator=
          (ArrayWithPreallocation<soul::Structure::Member,_8UL> *this,
          ArrayWithPreallocation<soul::Structure::Member,_8UL> *other)

{
  char *pcVar1;
  Member *pMVar2;
  Member *pMVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  
  uVar6 = other->numActive;
  if (this->numActive < uVar6) {
    reserve(this,uVar6);
    sVar7 = this->numActive;
    if (sVar7 != 0) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        pMVar2 = other->items;
        pMVar3 = this->items;
        Type::operator=((Type *)(&(pMVar3->type).category + lVar8),
                        (Type *)(&(pMVar2->type).category + lVar8));
        std::__cxx11::string::_M_assign((string *)((long)&(pMVar3->name)._M_dataplus._M_p + lVar8));
        *(undefined8 *)((long)&(pMVar3->readWriteCount).numReads + lVar8) =
             *(undefined8 *)((long)&(pMVar2->readWriteCount).numReads + lVar8);
        uVar6 = uVar6 + 1;
        sVar7 = this->numActive;
        lVar8 = lVar8 + 0x40;
      } while (uVar6 < sVar7);
    }
    uVar6 = other->numActive;
    if (sVar7 < uVar6) {
      lVar8 = sVar7 << 6;
      do {
        pMVar2 = this->items;
        pMVar3 = other->items;
        *(undefined4 *)(&(pMVar2->type).category + lVar8) =
             *(undefined4 *)(&(pMVar3->type).category + lVar8);
        *(undefined4 *)((long)&(pMVar2->type).primitiveType.type + lVar8) =
             *(undefined4 *)((long)&(pMVar3->type).primitiveType.type + lVar8);
        *(undefined8 *)((long)&(pMVar2->type).boundingSize + lVar8) =
             *(undefined8 *)((long)&(pMVar3->type).boundingSize + lVar8);
        piVar4 = *(int **)((long)&(pMVar3->type).structure.object + lVar8);
        *(int **)((long)&(pMVar2->type).structure.object + lVar8) = piVar4;
        if (piVar4 != (int *)0x0) {
          *piVar4 = *piVar4 + 1;
        }
        pcVar1 = (pMVar2->name).field_2._M_local_buf + lVar8;
        *(char **)(pcVar1 + -0x10) = pcVar1;
        lVar5 = *(long *)((long)&(pMVar3->name)._M_dataplus._M_p + lVar8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&(pMVar2->name)._M_dataplus._M_p + lVar8),lVar5,
                   *(long *)((long)&(pMVar3->name)._M_string_length + lVar8) + lVar5);
        *(undefined8 *)((long)&(pMVar2->readWriteCount).numReads + lVar8) =
             *(undefined8 *)((long)&(pMVar3->readWriteCount).numReads + lVar8);
        sVar7 = sVar7 + 1;
        uVar6 = other->numActive;
        lVar8 = lVar8 + 0x40;
      } while (sVar7 < uVar6);
    }
    this->numActive = uVar6;
  }
  else {
    shrink(this,uVar6);
    if (this->numActive != 0) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        pMVar2 = other->items;
        pMVar3 = this->items;
        Type::operator=((Type *)(&(pMVar3->type).category + lVar8),
                        (Type *)(&(pMVar2->type).category + lVar8));
        std::__cxx11::string::_M_assign((string *)((long)&(pMVar3->name)._M_dataplus._M_p + lVar8));
        *(undefined8 *)((long)&(pMVar3->readWriteCount).numReads + lVar8) =
             *(undefined8 *)((long)&(pMVar2->readWriteCount).numReads + lVar8);
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 0x40;
      } while (uVar6 < this->numActive);
    }
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (const ArrayWithPreallocation& other)
    {
        if (other.size() > numActive)
        {
            reserve (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];

            for (size_t i = numActive; i < other.size(); ++i)
                new (items + i) Item (other.items[i]);

            numActive = other.size();
        }
        else
        {
            shrink (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];
        }

        return *this;
    }